

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

int ncnn::count_expression_blobs(string *expr)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  ulong in_RDI;
  int blob_index_1;
  int blob_index;
  char ch;
  size_t i;
  string t;
  int count;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  char local_39;
  ulong local_38;
  string local_30 [36];
  int local_c;
  ulong local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  for (local_38 = 0; uVar4 = local_38, uVar2 = std::__cxx11::string::size(), uVar4 < uVar2;
      local_38 = local_38 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](local_8);
    local_39 = *pcVar3;
    if (((local_39 == '(') || (local_39 == ')')) || (local_39 == ',')) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        lVar5 = std::__cxx11::string::size();
        if ((((lVar5 == 2) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), '/' < *pcVar3)) &&
            (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 < ':')) &&
           (((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'w' ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'h'))
            || ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'd'
                || (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30),
                   *pcVar3 == 'c')))))) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
          local_50 = *pcVar3 + -0x30;
          local_54 = *pcVar3 + -0x2f;
          piVar6 = std::max<int>(&local_c,&local_54);
          local_c = *piVar6;
        }
        std::__cxx11::string::clear();
      }
    }
    else {
      std::__cxx11::string::operator+=(local_30,local_39);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if (((((uVar4 & 1) == 0) && (lVar5 = std::__cxx11::string::size(), lVar5 == 2)) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), '/' < *pcVar3)) &&
     ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 < ':' &&
      (((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'w' ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'h')) ||
       ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'd' ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30), *pcVar3 == 'c'))))))))
  {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    local_58 = *pcVar3 + -0x30;
    local_5c = *pcVar3 + -0x2f;
    piVar6 = std::max<int>(&local_c,&local_5c);
    local_c = *piVar6;
  }
  iVar1 = local_c;
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int count_expression_blobs(const std::string& expr)
{
    int count = 0;

    std::string t;
    for (size_t i = 0; i < expr.size(); i++)
    {
        char ch = expr[i];

        if (ch == '(' || ch == ')' || ch == ',')
        {
            if (!t.empty())
            {
                if (t.size() == 2 && (t[0] >= '0' && t[0] <= '9') && (t[1] == 'w' || t[1] == 'h' || t[1] == 'd' || t[1] == 'c'))
                {
                    int blob_index = t[0] - '0';
                    count = std::max(count, blob_index + 1);
                }

                t.clear();
            }
        }
        else
        {
#if NCNN_SIMPLESTL
            t.resize(t.size() + 1);
            t[t.size() - 1] = ch;
#else
            t += ch;
#endif
        }
    }

    if (!t.empty())
    {
        if (t.size() == 2 && (t[0] >= '0' && t[0] <= '9') && (t[1] == 'w' || t[1] == 'h' || t[1] == 'd' || t[1] == 'c'))
        {
            int blob_index = t[0] - '0';
            count = std::max(count, blob_index + 1);
        }
    }

    return count;
}